

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void extract_char(CHAR_DATA *ch,bool fPull)

{
  short *psVar1;
  OBJ_DATA *pOVar2;
  MOB_INDEX_DATA *pMVar3;
  OBJ_DATA *obj;
  CHAR_DATA *pCVar4;
  CHAR_DATA *pCVar5;
  bool bVar6;
  AFFECT_DATA *pAVar7;
  ROOM_INDEX_DATA *pRVar8;
  CHAR_DATA *pCVar9;
  CHAR_DATA **ppCVar10;
  char *args;
  ROOM_AFFECT_DATA *paf;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  char vn [50];
  char *local_70;
  char local_68 [56];
  
  if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
    bVar6 = is_npc(ch);
    if (bVar6) {
      sprintf(local_68,"%d",(ulong)(uint)(int)ch->pIndexData->vnum);
    }
    bVar6 = is_npc(ch);
    args = "Name is ";
    if (bVar6) {
      args = "Vnum is ";
    }
    bVar6 = is_npc(ch);
    if (bVar6) {
      local_70 = local_68;
    }
    else {
      local_70 = ch->name;
    }
    fmt._M_str = "Extract_char: in_room is nullptr.  {}{}.";
    fmt._M_len = 0x28;
    CLogger::Warn<char_const(&)[9],char*>
              ((CLogger *)&RS.field_0x140,fmt,(char (*) [9])args,&local_70);
  }
  ppCVar10 = &char_list;
  for (pCVar9 = char_list; pCVar9 != (CHAR_DATA *)0x0; pCVar9 = pCVar9->next) {
    if (pCVar9->last_fought == ch) {
      pCVar9->last_fought = (CHAR_DATA *)0x0;
    }
    bVar6 = is_npc(ch);
    if (((!bVar6) && (bVar6 = is_npc(pCVar9), !bVar6)) && (pCVar9->last_fight_name == ch->true_name)
       ) {
      pCVar9->last_fight_name = (char *)0x0;
    }
    bVar6 = is_npc(pCVar9);
    if (((!bVar6) && (bVar6 = is_npc(ch), !bVar6)) && (pCVar9->pcdata->trusting == ch)) {
      pCVar9->pcdata->trusting = (CHAR_DATA *)0x0;
    }
    for (pAVar7 = pCVar9->affected; pAVar7 != (AFFECT_DATA *)0x0; pAVar7 = pAVar7->next) {
      if (pAVar7->owner == ch) {
        pAVar7->owner = (CHAR_DATA *)0x0;
      }
    }
  }
  nuke_pets(ch);
  ch->pet = (CHAR_DATA *)0x0;
  if (fPull) {
    die_follower(ch);
  }
  stop_fighting(ch,true);
  pOVar2 = ch->carrying;
  while (obj = pOVar2, obj != (OBJ_DATA *)0x0) {
    pOVar2 = obj->next_content;
    if (((obj->wear_loc != 0x13) && ((obj->extra_flags[0] & 0x20000) == 0)) &&
       (bVar6 = is_npc(ch), !bVar6)) {
      bVar6 = is_npc(ch);
      if (!bVar6 && fPull) {
        psVar1 = &obj->pIndexData->limcount;
        *psVar1 = *psVar1 + 1;
      }
      extract_obj(obj);
    }
  }
  char_from_room(ch);
  bVar6 = is_npc(ch);
  if ((bVar6) && (bVar6 = CQueue::HasQueuePending(&RS.Queue,ch), bVar6)) {
    fmt_00._M_str =
         "Attempt at extracting mob {} while it has queue events pending.  Deleting events.";
    fmt_00._M_len = 0x51;
    CLogger::Warn<short&>((CLogger *)&RS.field_0x140,fmt_00,&ch->pIndexData->vnum);
    CQueue::DeleteQueuedEventsInvolving(&RS.Queue,ch);
  }
  if ((fPull) || (bVar6 = is_npc(ch), bVar6)) {
    bVar6 = is_npc(ch);
    if (bVar6) {
      pMVar3 = ch->pIndexData;
      psVar1 = &pMVar3->count;
      *psVar1 = *psVar1 + -1;
      total_wealth = total_wealth - pMVar3->wealth;
    }
    pCVar9 = char_list;
    pCVar4 = char_list;
    pRVar8 = top_affected_room;
    if ((ch->desc != (DESCRIPTOR_DATA *)0x0) && (ch->desc->original != (CHAR_DATA *)0x0)) {
      do_return(ch,"");
      ch->desc = (DESCRIPTOR_DATA *)0x0;
      pCVar9 = char_list;
      pCVar4 = char_list;
      pRVar8 = top_affected_room;
    }
    for (; pCVar5 = char_list, top_affected_room = pRVar8, pCVar9 != (CHAR_DATA *)0x0;
        pCVar9 = pCVar9->next) {
      char_list = pCVar4;
      if (pCVar9->reply == ch) {
        pCVar9->reply = (CHAR_DATA *)0x0;
      }
      pCVar4 = char_list;
      pRVar8 = top_affected_room;
      char_list = pCVar5;
    }
    pCVar9 = char_list;
    char_list = pCVar4;
    if (pRVar8 == (ROOM_INDEX_DATA *)0x0) goto LAB_0029f95e;
    do {
      for (paf = pRVar8->affected; paf != (ROOM_AFFECT_DATA *)0x0; paf = paf->next) {
        if (paf->owner == ch) {
          affect_remove_room(pRVar8,paf);
        }
      }
      pRVar8 = pRVar8->aff_next;
    } while (pRVar8 != (ROOM_INDEX_DATA *)0x0);
    do {
      pCVar9 = ((CHAR_DATA *)ppCVar10)->next;
LAB_0029f95e:
      if (pCVar9 == ch) {
        ((CHAR_DATA *)ppCVar10)->next = ch->next;
        if (ch->desc != (DESCRIPTOR_DATA *)0x0) {
          ch->desc->character = (CHAR_DATA *)0x0;
        }
        free_char(ch);
        return;
      }
      ppCVar10 = &pCVar9->next;
    } while (pCVar9 != (CHAR_DATA *)0x0);
    fmt_01._M_str = "Extract_char: char not found.";
    fmt_01._M_len = 0x1d;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_01);
  }
  else {
    pRVar8 = get_room_index(0);
    char_to_room(ch,pRVar8);
  }
  return;
}

Assistant:

void extract_char(CHAR_DATA *ch, bool fPull)
{
	CHAR_DATA *wch;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;
	CHAR_DATA *tch;
	ROOM_INDEX_DATA *room;
	ROOM_AFFECT_DATA *raf;
	AFFECT_DATA *af;

	if (ch->in_room == nullptr)
	{
		char vn[50];

		if (is_npc(ch))
			sprintf(vn, "%d", ch->pIndexData->vnum);

		RS.Logger.Warn("Extract_char: in_room is nullptr.  {}{}.",
			is_npc(ch) ? "Vnum is " : "Name is ",
			is_npc(ch) ? vn : ch->name);
	}
	/* remove all tracking */
	for (tch = char_list; tch != nullptr; tch = tch->next)
	{
		if (tch->last_fought == ch)
			tch->last_fought = nullptr;

		if (!is_npc(ch) && !is_npc(tch) && tch->last_fight_name == ch->true_name)
			tch->last_fight_name = nullptr;

		if (!is_npc(tch) && !is_npc(ch) && tch->pcdata->trusting == ch)
			tch->pcdata->trusting = nullptr;

		for (af = tch->affected; af; af = af->next)
		{
			if (af->owner == ch)
				af->owner = nullptr;
		}
	}

	nuke_pets(ch);
	ch->pet = nullptr; /* just in case */

	if (fPull)
		die_follower(ch);

	stop_fighting(ch, true);

	for (obj = ch->carrying; obj != nullptr; obj = obj_next)
	{
		obj_next = obj->next_content;

		if (!(obj->wear_loc == WEAR_BRAND || IS_SET(obj->extra_flags, ITEM_FIXED)) && !is_npc(ch))
		{
			if (!is_npc(ch) && (fPull))
				obj->pIndexData->limcount++;

			extract_obj(obj);
		}
	}

	char_from_room(ch);

	if (is_npc(ch) && RS.Queue.HasQueuePending(ch))
	{
		RS.Logger.Warn("Attempt at extracting mob {} while it has queue events pending.  Deleting events.", ch->pIndexData->vnum);
		RS.Queue.DeleteQueuedEventsInvolving(ch);
	}

	/* Death room is set in the cabal table now */
	if (!fPull && !is_npc(ch))
		return char_to_room(ch, get_room_index(ROOM_VNUM_ALTAR));

	if (is_npc(ch))
	{
		--ch->pIndexData->count;
		total_wealth -= ch->pIndexData->wealth;
	}

	if (ch->desc != nullptr && ch->desc->original != nullptr)
	{
		do_return(ch, "");
		ch->desc = nullptr;
	}

	for (wch = char_list; wch != nullptr; wch = wch->next)
	{
		if (wch->reply == ch)
			wch->reply = nullptr;
	}

	for (room = top_affected_room; room; room = room->aff_next)
	{
		for (raf = room->affected; raf != nullptr; raf = raf->next)
		{
			if (raf->owner == ch)
			{
				affect_remove_room(room, raf);
			}
		}
	}

	if (ch == char_list)
	{
		char_list = ch->next;
	}
	else
	{
		CHAR_DATA *prev;
		for (prev = char_list; prev != nullptr; prev = prev->next)
		{
			if (prev->next == ch)
			{
				prev->next = ch->next;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("Extract_char: char not found.");
			return;
		}
	}

	if (ch->desc != nullptr)
		ch->desc->character = nullptr;

	free_char(ch);
}